

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

result_type __thiscall
WellTestCase<boost::random::well_engine<unsigned_int,_32UL,_17UL,_23UL,_11UL,_10UL,_7UL,_boost::random::detail::M3<-21>,_boost::random::detail::M3<6>,_boost::random::detail::M0,_boost::random::detail::M3<-13>,_boost::random::detail::M3<13>,_boost::random::detail::M2<-10>,_boost::random::detail::M2<-5>,_boost::random::detail::M3<13>,_boost::random::detail::no_tempering>,_3076024310U>
::generate(WellTestCase<boost::random::well_engine<unsigned_int,_32UL,_17UL,_23UL,_11UL,_10UL,_7UL,_boost::random::detail::M3<_21>,_boost::random::detail::M3<6>,_boost::random::detail::M0,_boost::random::detail::M3<_13>,_boost::random::detail::M3<13>,_boost::random::detail::M2<_10>,_boost::random::detail::M2<_5>,_boost::random::detail::M3<13>,_boost::random::detail::no_tempering>,_3076024310U>
           *this)

{
  result_type rVar1;
  long lVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint *p;
  uint state [17];
  uint *local_60;
  uint local_58 [18];
  
  lVar2 = 0;
  do {
    auVar4._8_4_ = (int)lVar2;
    auVar4._0_8_ = lVar2;
    auVar4._12_4_ = (int)((ulong)lVar2 >> 0x20);
    auVar5 = (auVar4 | _DAT_00126040) ^ _DAT_00126050;
    if (auVar5._4_4_ == -0x80000000 && auVar5._0_4_ < -0x7fffffef) {
      local_58[lVar2] = 1;
      local_58[lVar2 + 1] = 1;
    }
    auVar4 = (auVar4 | _DAT_00126030) ^ _DAT_00126050;
    if (auVar4._4_4_ == -0x80000000 && auVar4._0_4_ < -0x7fffffef) {
      local_58[lVar2 + 2] = 1;
      local_58[lVar2 + 3] = 1;
    }
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0x14);
  local_60 = local_58;
  boost::random::
  well_engine<unsigned_int,32ul,17ul,23ul,11ul,10ul,7ul,boost::random::detail::M3<-21>,boost::random::detail::M3<6>,boost::random::detail::M0,boost::random::detail::M3<-13>,boost::random::detail::M3<13>,boost::random::detail::M2<-10>,boost::random::detail::M2<-5>,boost::random::detail::M3<13>,boost::random::detail::no_tempering>
  ::seed<unsigned_int*>
            ((well_engine<unsigned_int,32ul,17ul,23ul,11ul,10ul,7ul,boost::random::detail::M3<_21>,boost::random::detail::M3<6>,boost::random::detail::M0,boost::random::detail::M3<_13>,boost::random::detail::M3<13>,boost::random::detail::M2<_10>,boost::random::detail::M2<_5>,boost::random::detail::M3<13>,boost::random::detail::no_tempering>
              *)this,&local_60,local_58 + 0x11);
  uVar3 = 0x3b9aca01;
  do {
    rVar1 = boost::random::
            well_engine<unsigned_int,_32UL,_17UL,_23UL,_11UL,_10UL,_7UL,_boost::random::detail::M3<-21>,_boost::random::detail::M3<6>,_boost::random::detail::M0,_boost::random::detail::M3<-13>,_boost::random::detail::M3<13>,_boost::random::detail::M2<-10>,_boost::random::detail::M2<-5>,_boost::random::detail::M3<13>,_boost::random::detail::no_tempering>
            ::operator()(&this->rng);
    uVar3 = uVar3 - 1;
  } while (1 < uVar3);
  return rVar1;
}

Assistant:

result_type generate()
    {
        unsigned state[RandomNumberGenerator::state_size];
        std::uninitialized_fill_n(state, boost::size(state), 1);

        unsigned* p = state;
        rng.seed(p, boost::end(state));

        result_type x;

        int iterations = 1000000000;

        while (iterations-- > 0)
            x = rng();

        return x;
    }